

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_read1(BGZF *fp,bam1_t *b)

{
  long lVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  ssize_t sVar28;
  uint8_t *__ptr;
  uint uVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int32_t block_len;
  uint32_t x [8];
  uint local_3c;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  uint local_28;
  int32_t iStack_24;
  int32_t iStack_20;
  int32_t iStack_1c;
  
  sVar28 = bgzf_read(fp,&local_3c,4);
  if ((int)sVar28 == 0) {
    iVar32 = -1;
  }
  else if ((int)sVar28 == 4) {
    sVar28 = bgzf_read(fp,&local_38,0x20);
    iVar32 = -3;
    if (sVar28 == 0x20) {
      if ((fp->field_0x2 & 0xc) != 0) {
        local_3c = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                   local_3c << 0x18;
        lVar31 = 0;
        do {
          auVar33 = *(undefined1 (*) [16])((long)&local_38 + lVar31 * 4);
          auVar34[1] = 0;
          auVar34[0] = auVar33[8];
          auVar34[2] = auVar33[9];
          auVar34[3] = 0;
          auVar34[4] = auVar33[10];
          auVar34[5] = 0;
          auVar34[6] = auVar33[0xb];
          auVar34[7] = 0;
          auVar34[8] = auVar33[0xc];
          auVar34[9] = 0;
          auVar34[10] = auVar33[0xd];
          auVar34[0xb] = 0;
          auVar34[0xc] = auVar33[0xe];
          auVar34[0xd] = 0;
          auVar34[0xe] = auVar33[0xf];
          auVar34[0xf] = 0;
          auVar34 = pshuflw(auVar34,auVar34,0x1b);
          auVar34 = pshufhw(auVar34,auVar34,0x1b);
          auVar18[0xd] = 0;
          auVar18._0_13_ = auVar33._0_13_;
          auVar18[0xe] = auVar33[7];
          auVar19[0xc] = auVar33[6];
          auVar19._0_12_ = auVar33._0_12_;
          auVar19._13_2_ = auVar18._13_2_;
          auVar20[0xb] = 0;
          auVar20._0_11_ = auVar33._0_11_;
          auVar20._12_3_ = auVar19._12_3_;
          auVar21[10] = auVar33[5];
          auVar21._0_10_ = auVar33._0_10_;
          auVar21._11_4_ = auVar20._11_4_;
          auVar22[9] = 0;
          auVar22._0_9_ = auVar33._0_9_;
          auVar22._10_5_ = auVar21._10_5_;
          auVar23[8] = auVar33[4];
          auVar23._0_8_ = auVar33._0_8_;
          auVar23._9_6_ = auVar22._9_6_;
          auVar25._7_8_ = 0;
          auVar25._0_7_ = auVar23._8_7_;
          auVar26._1_8_ = SUB158(auVar25 << 0x40,7);
          auVar26[0] = auVar33[3];
          auVar26._9_6_ = 0;
          auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
          auVar27[0] = auVar33[2];
          auVar27._11_4_ = 0;
          auVar24[2] = auVar33[1];
          auVar24._0_2_ = auVar33._0_2_;
          auVar24._3_12_ = SUB1512(auVar27 << 0x20,3);
          auVar33._0_2_ = auVar33._0_2_ & 0xff;
          auVar33._2_13_ = auVar24._2_13_;
          auVar33[0xf] = 0;
          auVar33 = pshuflw(auVar33,auVar33,0x1b);
          auVar33 = pshufhw(auVar33,auVar33,0x1b);
          sVar2 = auVar33._0_2_;
          sVar3 = auVar33._2_2_;
          sVar4 = auVar33._4_2_;
          sVar5 = auVar33._6_2_;
          sVar6 = auVar33._8_2_;
          sVar7 = auVar33._10_2_;
          sVar8 = auVar33._12_2_;
          sVar9 = auVar33._14_2_;
          sVar10 = auVar34._0_2_;
          sVar11 = auVar34._2_2_;
          sVar12 = auVar34._4_2_;
          sVar13 = auVar34._6_2_;
          sVar14 = auVar34._8_2_;
          sVar15 = auVar34._10_2_;
          sVar16 = auVar34._12_2_;
          sVar17 = auVar34._14_2_;
          lVar1 = lVar31 * 4;
          *(char *)((long)&local_38 + lVar1) =
               (0 < sVar2) * (sVar2 < 0x100) * auVar33[0] - (0xff < sVar2);
          *(char *)((long)&local_38 + lVar1 + 1) =
               (0 < sVar3) * (sVar3 < 0x100) * auVar33[2] - (0xff < sVar3);
          *(char *)((long)&local_38 + lVar1 + 2) =
               (0 < sVar4) * (sVar4 < 0x100) * auVar33[4] - (0xff < sVar4);
          *(char *)((long)&local_38 + lVar1 + 3) =
               (0 < sVar5) * (sVar5 < 0x100) * auVar33[6] - (0xff < sVar5);
          *(char *)((long)&local_38 + lVar1 + 4) =
               (0 < sVar6) * (sVar6 < 0x100) * auVar33[8] - (0xff < sVar6);
          *(char *)((long)&local_38 + lVar1 + 5) =
               (0 < sVar7) * (sVar7 < 0x100) * auVar33[10] - (0xff < sVar7);
          *(char *)((long)&local_38 + lVar1 + 6) =
               (0 < sVar8) * (sVar8 < 0x100) * auVar33[0xc] - (0xff < sVar8);
          *(char *)((long)&local_38 + lVar1 + 7) =
               (0 < sVar9) * (sVar9 < 0x100) * auVar33[0xe] - (0xff < sVar9);
          *(char *)(&local_30 + lVar31) =
               (0 < sVar10) * (sVar10 < 0x100) * auVar34[0] - (0xff < sVar10);
          *(char *)((long)&local_30 + lVar1 + 1) =
               (0 < sVar11) * (sVar11 < 0x100) * auVar34[2] - (0xff < sVar11);
          *(char *)((long)&local_30 + lVar1 + 2) =
               (0 < sVar12) * (sVar12 < 0x100) * auVar34[4] - (0xff < sVar12);
          *(char *)((long)&local_30 + lVar1 + 3) =
               (0 < sVar13) * (sVar13 < 0x100) * auVar34[6] - (0xff < sVar13);
          *(char *)(&local_2c + lVar31) =
               (0 < sVar14) * (sVar14 < 0x100) * auVar34[8] - (0xff < sVar14);
          *(char *)((long)&local_2c + lVar1 + 1) =
               (0 < sVar15) * (sVar15 < 0x100) * auVar34[10] - (0xff < sVar15);
          *(char *)((long)&local_2c + lVar1 + 2) =
               (0 < sVar16) * (sVar16 < 0x100) * auVar34[0xc] - (0xff < sVar16);
          *(char *)((long)&local_2c + lVar1 + 3) =
               (0 < sVar17) * (sVar17 < 0x100) * auVar34[0xe] - (0xff < sVar17);
          lVar31 = lVar31 + 4;
        } while (lVar31 != 8);
      }
      (b->core).tid = (undefined4)local_38;
      (b->core).pos = local_38._4_4_;
      *(ulong *)&(b->core).field_0x8 =
           (ulong)local_2c << 0x30 | (ulong)(local_2c >> 0x10) << 0x20 |
           (ulong)(local_30 << 0x18 | (local_30 & 0xff00) << 8 | local_30 >> 0x10);
      (b->core).l_qseq = local_28;
      (b->core).mtid = iStack_24;
      (b->core).mpos = iStack_20;
      (b->core).isize = iStack_1c;
      uVar29 = local_3c - 0x20;
      b->l_data = uVar29;
      iVar32 = -4;
      if ((-1 < (int)local_28 && 0x1f < (int)local_3c) &&
         (__ptr = b->data,
         (ulong)local_28 + (ulong)(local_30 & 0xff) + (ulong)(ushort)local_2c * 4 +
         (ulong)(local_28 + 1 >> 1) <= (ulong)uVar29)) {
        if (b->m_data < (int)uVar29) {
          uVar29 = (int)(local_3c - 0x21) >> 1 | local_3c - 0x21;
          uVar29 = (int)uVar29 >> 2 | uVar29;
          uVar29 = (int)uVar29 >> 4 | uVar29;
          uVar29 = (int)uVar29 >> 8 | uVar29;
          iVar30 = ((int)uVar29 >> 0x10 | uVar29) + 1;
          b->m_data = iVar30;
          __ptr = (uint8_t *)realloc(__ptr,(long)iVar30);
          b->data = __ptr;
          if (__ptr == (uint8_t *)0x0) {
            return -4;
          }
          uVar29 = b->l_data;
        }
        sVar28 = bgzf_read(fp,__ptr,(long)(int)uVar29);
        if (sVar28 == b->l_data) {
          if ((fp->field_0x2 & 0xc) != 0) {
            swap_data(&b->core,b->l_data,b->data,0);
          }
          iVar32 = local_3c + 4;
        }
      }
    }
  }
  else {
    iVar32 = -2;
  }
  return iVar32;
}

Assistant:

int bam_read1(BGZF *fp, bam1_t *b)
{
    bam1_core_t *c = &b->core;
    int32_t block_len, ret, i;
    uint32_t x[8];
    if ((ret = bgzf_read(fp, &block_len, 4)) != 4) {
        if (ret == 0) return -1; // normal end-of-file
        else return -2; // truncated
    }
    if (bgzf_read(fp, x, 32) != 32) return -3;
    if (fp->is_be) {
        ed_swap_4p(&block_len);
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
    }
    c->tid = x[0]; c->pos = x[1];
    c->bin = x[2]>>16; c->qual = x[2]>>8&0xff; c->l_qname = x[2]&0xff;
    c->flag = x[3]>>16; c->n_cigar = x[3]&0xffff;
    c->l_qseq = x[4];
    c->mtid = x[5]; c->mpos = x[6]; c->isize = x[7];
    b->l_data = block_len - 32;
    if (b->l_data < 0 || c->l_qseq < 0) return -4;
    if ((char *)bam_get_aux(b) - (char *)b->data > b->l_data)
        return -4;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
        if (!b->data)
            return -4;
    }
    if (bgzf_read(fp, b->data, b->l_data) != b->l_data) return -4;
    //b->l_aux = b->l_data - c->n_cigar * 4 - c->l_qname - c->l_qseq - (c->l_qseq+1)/2;
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return 4 + block_len;
}